

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::
TypedExpectation<const_solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
::Matches(TypedExpectation<const_solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = MatcherBase<solitaire::piles::PileId>::Matches
                    ((MatcherBase<solitaire::piles::PileId> *)&this->matchers_,(PileId *)args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<solitaire::piles::PileId>_&>::Matches
                      (&(this->extra_matcher_).
                        super_MatcherBase<const_std::tuple<solitaire::piles::PileId>_&>,args);
    return bVar1;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }